

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_object_manager.cpp
# Opt level: O3

void __thiscall sc_core::sc_object_manager::~sc_object_manager(sc_object_manager *this)

{
  pointer ppsVar1;
  _Self __tmp;
  _Rb_tree_node_base *p_Var2;
  
  for (p_Var2 = (this->m_instance_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var2 != &(this->m_instance_table)._M_t._M_impl.super__Rb_tree_header;
      p_Var2 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var2)) {
    if (*(int *)&p_Var2[2]._M_parent == 1) {
      *(undefined8 *)(*(long *)(p_Var2 + 2) + 0x68) = 0;
    }
  }
  ppsVar1 = (this->m_object_stack).
            super__Vector_base<sc_core::sc_object_*,_std::allocator<sc_core::sc_object_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if (ppsVar1 != (pointer)0x0) {
    operator_delete(ppsVar1);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sc_core::sc_object_manager::table_entry>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sc_core::sc_object_manager::table_entry>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_sc_core::sc_object_manager::table_entry>_>_>
  ::_M_erase(&(this->m_instance_table)._M_t,
             (_Link_type)
             (this->m_instance_table)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent);
  return;
}

Assistant:

sc_object_manager::~sc_object_manager()
{
    instance_table_t::iterator it;     // instance table iterator.

    for ( it = m_instance_table.begin(); it != m_instance_table.end(); it++) 
    {
        if(it->second.m_name_origin == SC_NAME_OBJECT) {
            sc_object* obj_p = static_cast<sc_object*>(it->second.m_element_p);
            obj_p->m_simc = 0;
        }
    }
}